

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.hpp
# Opt level: O0

void __thiscall
deqp::gls::fboc::details::ParamTest<deqp::gles3::Functional::NumLayersParams>::ParamTest
          (ParamTest<deqp::gles3::Functional::NumLayersParams> *this,Context *ctx,Params *params)

{
  GLsizei GVar1;
  NumLayersParams *params_00;
  string local_60;
  string local_40;
  NumLayersParams *local_20;
  Params *params_local;
  Context *ctx_local;
  ParamTest<deqp::gles3::Functional::NumLayersParams> *this_local;
  
  local_20 = params;
  params_local = (Params *)ctx;
  ctx_local = (Context *)this;
  deqp::gles3::Functional::NumLayersParams::getName_abi_cxx11_(&local_40,params,params);
  deqp::gles3::Functional::NumLayersParams::getDescription_abi_cxx11_(&local_60,local_20,params_00);
  TestBase::TestBase(&this->super_TestBase,ctx,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ParamTest_032b2408;
  GVar1 = local_20->numLayers;
  (this->m_params).textureKind = local_20->textureKind;
  (this->m_params).numLayers = GVar1;
  (this->m_params).attachmentLayer = local_20->attachmentLayer;
  return;
}

Assistant:

ParamTest		(Context& ctx, const Params& params)
					: TestBase	(ctx, Params::getName(params), Params::getDescription(params))
					, m_params	(params) {}